

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O3

void __thiscall HEkkDual::initSlice(HEkkDual *this,HighsInt initial_num_slice)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  int size_;
  vector<int,_std::allocator<int>_> sliced_Astart;
  vector<int,_std::allocator<int>_> local_48;
  
  uVar5 = 1;
  if (1 < initial_num_slice) {
    uVar5 = (ulong)(uint)initial_num_slice;
  }
  this->slice_num = (HighsInt)uVar5;
  if (8 < initial_num_slice) {
    highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kWarning,
                "WARNING: %d = slice_num > kHighsSlicedLimit = %d so truncating slice_num\n",uVar5,8
               );
    this->slice_num = 8;
    uVar5 = 8;
  }
  piVar3 = (this->a_matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = this->solver_num_col;
  iVar2 = piVar3[iVar1];
  this->slice_start[0] = 0;
  lVar7 = 0;
  uVar8 = 0;
  do {
    if (uVar8 == (int)uVar5 - 1) {
      iVar6 = this->slice_num;
      goto LAB_0034a688;
    }
    iVar6 = (int)uVar8;
    lVar9 = (long)(int)lVar7;
    do {
      lVar7 = lVar9 + 1;
      lVar4 = lVar9 + 1;
      lVar9 = lVar7;
    } while (piVar3[lVar4] < (int)((double)(int)(uVar8 + 1) * ((double)iVar2 / (double)(int)uVar5)))
    ;
    this->slice_start[uVar8 + 1] = (int)lVar7;
    uVar8 = uVar8 + 1;
  } while ((int)lVar7 < iVar1);
  this->slice_num = iVar6;
LAB_0034a688:
  this->slice_start[iVar6] = iVar1;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  for (lVar7 = 0; lVar7 < this->slice_num; lVar7 = lVar7 + 1) {
    iVar1 = this->slice_start[lVar7];
    lVar9 = (long)iVar1;
    iVar2 = this->slice_start[lVar7 + 1];
    iVar6 = piVar3[lVar9];
    std::vector<int,_std::allocator<int>_>::resize(&local_48,(iVar2 - lVar9) + 1);
    size_ = (int)(iVar2 - lVar9);
    if (-1 < size_) {
      uVar5 = 0;
      do {
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar5] = piVar3[lVar9 + uVar5] - iVar6;
        uVar5 = uVar5 + 1;
      } while ((iVar2 - iVar1) + 1 != uVar5);
    }
    HighsSparseMatrix::createSlice
              (this->slice_a_matrix + lVar7,&(this->ekk_instance_->lp_).a_matrix_,iVar1,iVar2 + -1);
    HighsSparseMatrix::createRowwise(this->slice_ar_matrix + lVar7,this->slice_a_matrix + lVar7);
    HVectorBase<double>::setup(this->slice_row_ap + lVar7,size_);
    HEkkDualRow::setupSlice
              ((this->slice_dualRow).super__Vector_base<HEkkDualRow,_std::allocator<HEkkDualRow>_>.
               _M_impl.super__Vector_impl_data._M_start + lVar7,size_);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HEkkDual::initSlice(const HighsInt initial_num_slice) {
  // Number of slices
  slice_num = initial_num_slice;
  if (slice_num < 1) slice_num = 1;
  assert(slice_num <= kHighsSlicedLimit);
  if (slice_num > kHighsSlicedLimit) {
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kWarning,
                "WARNING: %" HIGHSINT_FORMAT
                " = slice_num > kHighsSlicedLimit = %" HIGHSINT_FORMAT
                " so truncating "
                "slice_num\n",
                slice_num, kHighsSlicedLimit);
    slice_num = kHighsSlicedLimit;
  }

  // Alias to the matrix
  const HighsInt* Astart = a_matrix->start_.data();
  const HighsInt AcountX = Astart[solver_num_col];

  // Figure out partition weight
  double sliced_countX = AcountX / (double)slice_num;
  slice_start[0] = 0;
  for (HighsInt i = 0; i < slice_num - 1; i++) {
    HighsInt endColumn = slice_start[i] + 1;  // At least one column
    HighsInt endX = Astart[endColumn];
    HighsInt stopX = (i + 1) * sliced_countX;
    while (endX < stopX) {
      endX = Astart[++endColumn];
    }
    slice_start[i + 1] = endColumn;
    if (endColumn >= solver_num_col) {
      slice_num = i;  // SHRINK
      break;
    }
  }
  slice_start[slice_num] = solver_num_col;

  // Partition the matrix, row_ap and related packet
  vector<HighsInt> sliced_Astart;
  for (HighsInt i = 0; i < slice_num; i++) {
    // The matrix
    HighsInt from_col = slice_start[i];
    HighsInt to_col = slice_start[i + 1] - 1;
    HighsInt slice_num_col = slice_start[i + 1] - from_col;
    HighsInt from_el = Astart[from_col];
    sliced_Astart.resize(slice_num_col + 1);
    for (HighsInt k = 0; k <= slice_num_col; k++)
      sliced_Astart[k] = Astart[k + from_col] - from_el;
    slice_a_matrix[i].createSlice(ekk_instance_.lp_.a_matrix_, from_col,
                                  to_col);
    slice_ar_matrix[i].createRowwise(slice_a_matrix[i]);

    // The row_ap and its packages
    slice_row_ap[i].setup(slice_num_col);
    slice_dualRow[i].setupSlice(slice_num_col);
  }
}